

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall CGL::SceneObjects::Mesh::Mesh(Mesh *this,HalfedgeMesh *mesh,BSDF *bsdf)

{
  value_type pVVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  mapped_type mVar4;
  ulong uVar5;
  bool bVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  Vector3D *pVVar9;
  reference ppVVar10;
  _func_int **pp_Var11;
  _func_int **in_RDX;
  SceneObject *in_RDI;
  HalfedgeCIter h;
  FaceCIter f;
  int i;
  Vertex *v;
  VertexCIter it;
  size_t vertexI;
  vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_> verts;
  unordered_map<const_CGL::Vertex_*,_int,_std::hash<const_CGL::Vertex_*>,_std::equal_to<const_CGL::Vertex_*>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>_>
  vertexLabels;
  Face *in_stack_fffffffffffffdd8;
  unordered_map<const_CGL::Vertex_*,_int,_std::hash<const_CGL::Vertex_*>,_std::equal_to<const_CGL::Vertex_*>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>_>
  *in_stack_fffffffffffffde0;
  value_type *in_stack_fffffffffffffde8;
  HalfedgeCIter in_stack_fffffffffffffdf0;
  Vector3D *local_198;
  Vector3D *local_170;
  _Self local_b8;
  _Self local_b0;
  int local_a4;
  _List_node_base *local_a0;
  reference local_98;
  _Self local_90 [3];
  _Self local_78;
  ulong local_70;
  vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_> local_68 [3];
  _func_int **local_18;
  
  local_18 = in_RDX;
  SceneObject::SceneObject(in_RDI);
  in_RDI->_vptr_SceneObject = (_func_int **)&PTR_get_primitives_00397e50;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x11975b);
  std::
  unordered_map<const_CGL::Vertex_*,_int,_std::hash<const_CGL::Vertex_*>,_std::equal_to<const_CGL::Vertex_*>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>_>
  ::unordered_map((unordered_map<const_CGL::Vertex_*,_int,_std::hash<const_CGL::Vertex_*>,_std::equal_to<const_CGL::Vertex_*>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>_>
                   *)0x119768);
  std::vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_>::vector
            ((vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_> *)0x119775);
  local_70 = 0;
  local_78._M_node =
       (_List_node_base *)HalfedgeMesh::verticesBegin((HalfedgeMesh *)in_stack_fffffffffffffdd8);
  while( true ) {
    local_90[0]._M_node =
         (_List_node_base *)HalfedgeMesh::verticesEnd((HalfedgeMesh *)in_stack_fffffffffffffdd8);
    bVar6 = std::operator!=(&local_78,local_90);
    uVar5 = local_70;
    if (!bVar6) break;
    local_98 = std::_List_const_iterator<CGL::Vertex>::operator*
                         ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffde0);
    std::vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_>::push_back
              ((vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_> *)
               in_stack_fffffffffffffdf0._M_node,in_stack_fffffffffffffde8);
    mVar4 = (mapped_type)local_70;
    pmVar7 = std::
             unordered_map<const_CGL::Vertex_*,_int,_std::hash<const_CGL::Vertex_*>,_std::equal_to<const_CGL::Vertex_*>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>_>
             ::operator[](in_stack_fffffffffffffde0,(key_type *)in_stack_fffffffffffffdd8);
    *pmVar7 = mVar4;
    local_70 = local_70 + 1;
    local_a0 = (_List_node_base *)std::_List_const_iterator<CGL::Vertex>::operator++(&local_78,0);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_70;
  uVar8 = SUB168(auVar2 * ZEXT816(0x20),0);
  if (SUB168(auVar2 * ZEXT816(0x20),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pVVar9 = (Vector3D *)operator_new__(uVar8);
  if (uVar5 != 0) {
    local_170 = pVVar9;
    do {
      Vector3D::Vector3D(local_170);
      local_170 = local_170 + 1;
    } while (local_170 != pVVar9 + uVar5);
  }
  uVar5 = local_70;
  in_RDI[1]._vptr_SceneObject = (_func_int **)pVVar9;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_70;
  uVar8 = SUB168(auVar3 * ZEXT816(0x20),0);
  if (SUB168(auVar3 * ZEXT816(0x20),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pVVar9 = (Vector3D *)operator_new__(uVar8);
  if (uVar5 != 0) {
    local_198 = pVVar9;
    do {
      Vector3D::Vector3D(local_198);
      local_198 = local_198 + 1;
    } while (local_198 != pVVar9 + uVar5);
  }
  in_RDI[2]._vptr_SceneObject = (_func_int **)pVVar9;
  for (local_a4 = 0; (ulong)(long)local_a4 < local_70; local_a4 = local_a4 + 1) {
    ppVVar10 = std::vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_>::operator[]
                         (local_68,(long)local_a4);
    pVVar1 = *ppVVar10;
    pp_Var11 = in_RDI[1]._vptr_SceneObject + (long)local_a4 * 4;
    *pp_Var11 = (_func_int *)(pVVar1->position).field_0.field_0.x;
    pp_Var11[1] = (_func_int *)(pVVar1->position).field_0.field_0.y;
    pp_Var11[2] = (_func_int *)(pVVar1->position).field_0.field_0.z;
    pp_Var11[3] = *(_func_int **)((long)&(pVVar1->position).field_0 + 0x18);
    ppVVar10 = std::vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_>::operator[]
                         (local_68,(long)local_a4);
    pVVar1 = *ppVVar10;
    pp_Var11 = in_RDI[2]._vptr_SceneObject + (long)local_a4 * 4;
    *pp_Var11 = (_func_int *)(pVVar1->normal).field_0.field_0.x;
    pp_Var11[1] = (_func_int *)(pVVar1->normal).field_0.field_0.y;
    pp_Var11[2] = (_func_int *)(pVVar1->normal).field_0.field_0.z;
    pp_Var11[3] = *(_func_int **)((long)&(pVVar1->normal).field_0 + 0x18);
  }
  local_b0._M_node =
       (_List_node_base *)HalfedgeMesh::facesBegin((HalfedgeMesh *)in_stack_fffffffffffffdd8);
  while( true ) {
    local_b8._M_node =
         (_List_node_base *)HalfedgeMesh::facesEnd((HalfedgeMesh *)in_stack_fffffffffffffdd8);
    bVar6 = std::operator!=(&local_b0,&local_b8);
    if (!bVar6) break;
    std::_List_const_iterator<CGL::Face>::operator->
              ((_List_const_iterator<CGL::Face> *)in_stack_fffffffffffffde0);
    Face::halfedge(in_stack_fffffffffffffdd8);
    std::_List_const_iterator<CGL::Halfedge>::operator->
              ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffde0);
    Halfedge::vertex((Halfedge *)in_stack_fffffffffffffdd8);
    std::_List_const_iterator<CGL::Vertex>::operator*
              ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffde0);
    std::
    unordered_map<const_CGL::Vertex_*,_int,_std::hash<const_CGL::Vertex_*>,_std::equal_to<const_CGL::Vertex_*>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>_>
    ::operator[](in_stack_fffffffffffffde0,(key_type *)in_stack_fffffffffffffdd8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffde0,
               (value_type_conflict *)in_stack_fffffffffffffdd8);
    std::_List_const_iterator<CGL::Halfedge>::operator->
              ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffde0);
    Halfedge::next((Halfedge *)in_stack_fffffffffffffdd8);
    std::_List_const_iterator<CGL::Halfedge>::operator->
              ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffde0);
    Halfedge::vertex((Halfedge *)in_stack_fffffffffffffdd8);
    std::_List_const_iterator<CGL::Vertex>::operator*
              ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffde0);
    std::
    unordered_map<const_CGL::Vertex_*,_int,_std::hash<const_CGL::Vertex_*>,_std::equal_to<const_CGL::Vertex_*>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>_>
    ::operator[](in_stack_fffffffffffffde0,(key_type *)in_stack_fffffffffffffdd8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffde0,
               (value_type_conflict *)in_stack_fffffffffffffdd8);
    std::_List_const_iterator<CGL::Halfedge>::operator->
              ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffde0);
    Halfedge::next((Halfedge *)in_stack_fffffffffffffdd8);
    std::_List_const_iterator<CGL::Halfedge>::operator->
              ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffde0);
    in_stack_fffffffffffffdf0 = Halfedge::next((Halfedge *)in_stack_fffffffffffffdd8);
    std::_List_const_iterator<CGL::Halfedge>::operator->
              ((_List_const_iterator<CGL::Halfedge> *)in_stack_fffffffffffffde0);
    Halfedge::vertex((Halfedge *)in_stack_fffffffffffffdd8);
    std::_List_const_iterator<CGL::Vertex>::operator*
              ((_List_const_iterator<CGL::Vertex> *)in_stack_fffffffffffffde0);
    in_stack_fffffffffffffde0 =
         (unordered_map<const_CGL::Vertex_*,_int,_std::hash<const_CGL::Vertex_*>,_std::equal_to<const_CGL::Vertex_*>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>_>
          *)std::
            unordered_map<const_CGL::Vertex_*,_int,_std::hash<const_CGL::Vertex_*>,_std::equal_to<const_CGL::Vertex_*>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>_>
            ::operator[](in_stack_fffffffffffffde0,(key_type *)in_stack_fffffffffffffdd8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffde0,
               (value_type_conflict *)in_stack_fffffffffffffdd8);
    std::_List_const_iterator<CGL::Face>::operator++(&local_b0,0);
  }
  in_RDI[3]._vptr_SceneObject = local_18;
  std::vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_>::~vector
            ((vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_> *)
             in_stack_fffffffffffffdf0._M_node);
  std::
  unordered_map<const_CGL::Vertex_*,_int,_std::hash<const_CGL::Vertex_*>,_std::equal_to<const_CGL::Vertex_*>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>_>
  ::~unordered_map((unordered_map<const_CGL::Vertex_*,_int,_std::hash<const_CGL::Vertex_*>,_std::equal_to<const_CGL::Vertex_*>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>_>
                    *)0x119e48);
  return;
}

Assistant:

Mesh::Mesh(const HalfedgeMesh& mesh, BSDF* bsdf) {

  unordered_map<const Vertex *, int> vertexLabels;
  vector<const Vertex *> verts;

  size_t vertexI = 0;
  for (VertexCIter it = mesh.verticesBegin(); it != mesh.verticesEnd(); it++) {
    const Vertex *v = &*it;
    verts.push_back(v);
    vertexLabels[v] = vertexI;
    vertexI++;
  }

  positions = new Vector3D[vertexI];
  normals   = new Vector3D[vertexI];
  for (int i = 0; i < vertexI; i++) {
    positions[i] = verts[i]->position;
    normals[i]   = verts[i]->normal;
  }

  for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {
    HalfedgeCIter h = f->halfedge();
    indices.push_back(vertexLabels[&*h->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->next()->vertex()]);
  }

  this->bsdf = bsdf;

}